

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_set_channels(exr_context_t ctxt,int part_index,char *name,exr_attr_chlist_t *channels)

{
  undefined8 *puVar1;
  int iVar2;
  int *in_RCX;
  exr_attribute_list_t *in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_pixel_type_t unaff_retaddr;
  int32_t unaff_retaddr_00;
  char *in_stack_00000008;
  exr_attr_chlist_t *in_stack_00000010;
  exr_attr_chlist_entry_t *cur;
  int c;
  int numchans;
  exr_attr_chlist_t clist;
  exr_priv_part_t part;
  exr_result_t rv;
  exr_attribute_t *attr;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff9c;
  exr_attr_chlist_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar3;
  exr_attr_chlist_t *in_stack_ffffffffffffffb0;
  exr_context_t in_stack_ffffffffffffffb8;
  exr_attribute_list_t *list;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar4;
  long lVar5;
  undefined4 in_stack_ffffffffffffffe8;
  exr_perceptual_treatment_t in_stack_fffffffffffffffc;
  exr_result_t eVar6;
  
  lVar5 = 0;
  uVar4 = 0;
  if (in_RDI == (char *)0x0) {
    eVar6 = 2;
  }
  else {
    internal_exr_lock((exr_const_context_t_conflict)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock((exr_const_context_t_conflict)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      eVar6 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      list = *(exr_attribute_list_t **)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if ((in_RDX != (exr_attribute_list_t *)0x0) &&
         (iVar2 = strcmp((char *)in_RDX,"channels"), iVar2 == 0)) {
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        eVar6 = exr_set_channels((exr_context_t)CONCAT44(uVar4,in_stack_ffffffffffffffc8),
                                 (int)((ulong)list >> 0x20),
                                 (exr_attr_chlist_t *)in_stack_ffffffffffffffb8);
        return eVar6;
      }
      if ((*in_RDI == '\x01') || (*in_RDI == '\x04')) {
        if (in_RCX == (int *)0x0) {
          internal_exr_unlock((exr_const_context_t_conflict)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          eVar6 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,3,"No input values for setting \'%s\', type \'chlist\'",in_RDX);
        }
        else {
          eVar6 = exr_attr_list_find_by_name
                            ((exr_const_context_t_conflict)CONCAT44(uVar4,in_stack_ffffffffffffffc8)
                             ,list,(char *)in_stack_ffffffffffffffb8,
                             (exr_attribute_t **)in_stack_ffffffffffffffb0);
          if (eVar6 == 0xf) {
            eVar6 = exr_attr_list_add((exr_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                      in_RDX,(char *)in_RCX,
                                      (exr_attribute_type_t)((ulong)lVar5 >> 0x20),(int32_t)lVar5,
                                      (uint8_t **)CONCAT44(0xf,in_stack_ffffffffffffffc8),
                                      (exr_attribute_t **)CONCAT44(unaff_retaddr_00,unaff_retaddr));
          }
          if (eVar6 == 0) {
            if (in_RCX == (int *)0x0) {
              internal_exr_unlock((exr_const_context_t_conflict)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
              eVar6 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"No channels provided for channel list")
              ;
              return eVar6;
            }
            iVar2 = *in_RCX;
            eVar6 = exr_attr_chlist_init
                              ((exr_context_t)CONCAT44(iVar2,in_stack_ffffffffffffffa8),
                               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
            if (eVar6 != 0) {
              internal_exr_unlock((exr_const_context_t_conflict)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
              return eVar6;
            }
            for (iVar3 = 0; eVar6 = 0, iVar3 < iVar2; iVar3 = iVar3 + 1) {
              in_stack_ffffffffffffff90 =
                   *(undefined4 *)(*(long *)(in_RCX + 2) + (long)iVar3 * 0x20 + 0x1c);
              eVar6 = exr_attr_chlist_add_with_length
                                ((exr_context_t)cur,in_stack_00000010,in_stack_00000008,
                                 unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffffc,
                                 (int32_t)clist.entries,(int32_t)part);
              if (eVar6 != 0) {
                exr_attr_chlist_destroy(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
                internal_exr_unlock((exr_const_context_t_conflict)
                                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
                return eVar6;
              }
            }
            exr_attr_chlist_destroy(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
            puVar1 = *(undefined8 **)(lVar5 + 0x18);
            *puVar1 = in_stack_ffffffffffffffb0;
            puVar1[1] = in_stack_ffffffffffffffb8;
          }
          internal_exr_unlock((exr_const_context_t_conflict)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
      }
      else {
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        eVar6 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
    }
  }
  return eVar6;
}

Assistant:

exr_result_t
exr_attr_set_channels (
    exr_context_t            ctxt,
    int                      part_index,
    const char*              name,
    const exr_attr_chlist_t* channels)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (name && 0 == strcmp (name, EXR_REQ_CHANNELS_STR))
        return EXR_UNLOCK_AND_RETURN (
            exr_set_channels (ctxt, part_index, channels));

    /* do not support updating channels during update operation... */
    if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (!channels)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input values for setting '%s', type 'chlist'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        rv = exr_attr_list_add (
            ctxt, &(part->attributes), name, EXR_ATTR_CHLIST, 0, NULL, &(attr));
    }

    if (rv == EXR_ERR_SUCCESS)
    {
        exr_attr_chlist_t clist;
        int               numchans;

        if (!channels)
            return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "No channels provided for channel list"));

        numchans = channels->num_channels;
        rv       = exr_attr_chlist_init (ctxt, &clist, numchans);
        if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN (rv);

        for (int c = 0; c < numchans; ++c)
        {
            const exr_attr_chlist_entry_t* cur = channels->entries + c;

            rv = exr_attr_chlist_add_with_length (
                ctxt,
                &clist,
                cur->name.str,
                cur->name.length,
                cur->pixel_type,
                cur->p_linear,
                cur->x_sampling,
                cur->y_sampling);
            if (rv != EXR_ERR_SUCCESS)
            {
                exr_attr_chlist_destroy (ctxt, &clist);
                return EXR_UNLOCK_AND_RETURN (rv);
            }
        }

        exr_attr_chlist_destroy (ctxt, attr->chlist);
        *(attr->chlist) = clist;
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}